

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int mbedtls_x509_crt_verify_with_profile
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_profile *profile,char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy)

{
  mbedtls_x509_crt **ppmVar1;
  byte bVar2;
  short *psVar3;
  ulong uVar4;
  mbedtls_pk_type_t pk_alg;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  uchar *n2;
  mbedtls_x509_crt *parent;
  mbedtls_asn1_named_data *pmVar8;
  mbedtls_x509_buf *name;
  mbedtls_x509_crt *parent_00;
  
  if (profile == (mbedtls_x509_crt_profile *)0x0) {
    return -0x2800;
  }
  *flags = 0;
  if (cn != (char *)0x0) {
    sVar6 = strlen(cn);
    if ((crt->ext_types & 0x20) == 0) {
      pmVar8 = &crt->subject;
      do {
        if (((pmVar8->oid).len == 3) &&
           (psVar3 = (short *)(pmVar8->oid).p, (char)psVar3[1] == '\x03' && *psVar3 == 0x455)) {
          uVar4 = (pmVar8->val).len;
          if (uVar4 == sVar6) {
            if (sVar6 == 0) goto LAB_00123214;
            sVar7 = 0;
            while( true ) {
              bVar2 = (pmVar8->val).p[sVar7];
              if ((bVar2 != cn[sVar7]) &&
                 (((byte)(cn[sVar7] ^ bVar2) != 0x20 || (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)))))
              break;
              sVar7 = sVar7 + 1;
              if (sVar6 == sVar7) goto LAB_00123214;
            }
          }
          if (((2 < uVar4) && (*(short *)(pmVar8->val).p == 0x2e2a)) &&
             (iVar5 = x509_check_wildcard(cn,&pmVar8->val), iVar5 == 0)) goto LAB_00123214;
        }
        pmVar8 = pmVar8->next;
      } while (pmVar8 != (mbedtls_asn1_named_data *)0x0);
    }
    else {
      name = &(crt->subject_alt_names).buf;
      do {
        if (name->len == sVar6) {
          if (sVar6 == 0) goto LAB_00123214;
          sVar7 = 0;
          while( true ) {
            bVar2 = cn[sVar7];
            if ((bVar2 != name->p[sVar7]) &&
               (((name->p[sVar7] ^ bVar2) != 0x20 || (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)))))
            break;
            sVar7 = sVar7 + 1;
            if (sVar6 == sVar7) goto LAB_00123214;
          }
        }
        if (((2 < name->len) && (*(short *)name->p == 0x2e2a)) &&
           (iVar5 = x509_check_wildcard(cn,name), iVar5 == 0)) goto LAB_00123214;
        name = *(mbedtls_x509_buf **)(name + 1);
      } while (name != (mbedtls_x509_buf *)0x0);
    }
    *flags = 4;
  }
LAB_00123214:
  pk_alg = mbedtls_pk_get_type(&crt->pk);
  if ((profile->allowed_pks >> ((byte)((char)pk_alg - 1) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x80;
  }
  iVar5 = x509_profile_check_key(profile,pk_alg,&crt->pk);
  if (iVar5 != 0) {
    *(byte *)((long)flags + 2) = *(byte *)((long)flags + 2) | 1;
  }
  parent_00 = crt;
  parent = trust_ca;
  if (trust_ca != (mbedtls_x509_crt *)0x0) {
    do {
      iVar5 = x509_crt_check_parent(crt,parent,0,1);
      if (iVar5 == 0) goto LAB_001232e8;
      ppmVar1 = &parent->next;
      parent = *ppmVar1;
    } while (*ppmVar1 != (mbedtls_x509_crt *)0x0);
  }
  do {
    parent_00 = parent_00->next;
    parent = trust_ca;
    if (parent_00 == (mbedtls_x509_crt *)0x0) goto LAB_001232e8;
    iVar5 = x509_crt_check_parent(crt,parent_00,0,1);
  } while (iVar5 != 0);
  iVar5 = x509_crt_verify_child(crt,parent_00,trust_ca,ca_crl,profile,0,0,flags,f_vrfy,p_vrfy);
LAB_001232ff:
  if ((iVar5 == 0) && (iVar5 = -0x2700, *flags == 0)) {
    iVar5 = 0;
  }
  return iVar5;
LAB_001232e8:
  iVar5 = x509_crt_verify_top(crt,parent,ca_crl,profile,0,0,flags,f_vrfy,p_vrfy);
  goto LAB_001232ff;
}

Assistant:

int mbedtls_x509_crt_verify_with_profile( mbedtls_x509_crt *crt,
                     mbedtls_x509_crt *trust_ca,
                     mbedtls_x509_crl *ca_crl,
                     const mbedtls_x509_crt_profile *profile,
                     const char *cn, uint32_t *flags,
                     int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                     void *p_vrfy )
{
    size_t cn_len;
    int ret;
    int pathlen = 0, selfsigned = 0;
    mbedtls_x509_crt *parent;
    mbedtls_x509_name *name;
    mbedtls_x509_sequence *cur = NULL;
    mbedtls_pk_type_t pk_type;

    if( profile == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    *flags = 0;

    if( cn != NULL )
    {
        name = &crt->subject;
        cn_len = strlen( cn );

        if( crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME )
        {
            cur = &crt->subject_alt_names;

            while( cur != NULL )
            {
                if( cur->buf.len == cn_len &&
                    x509_memcasecmp( cn, cur->buf.p, cn_len ) == 0 )
                    break;

                if( cur->buf.len > 2 &&
                    memcmp( cur->buf.p, "*.", 2 ) == 0 &&
                    x509_check_wildcard( cn, &cur->buf ) == 0 )
                {
                    break;
                }

                cur = cur->next;
            }

            if( cur == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
        else
        {
            while( name != NULL )
            {
                if( MBEDTLS_OID_CMP( MBEDTLS_OID_AT_CN, &name->oid ) == 0 )
                {
                    if( name->val.len == cn_len &&
                        x509_memcasecmp( name->val.p, cn, cn_len ) == 0 )
                        break;

                    if( name->val.len > 2 &&
                        memcmp( name->val.p, "*.", 2 ) == 0 &&
                        x509_check_wildcard( cn, &name->val ) == 0 )
                        break;
                }

                name = name->next;
            }

            if( name == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
    }

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type( &crt->pk );

    if( x509_profile_check_pk_alg( profile, pk_type ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    if( x509_profile_check_key( profile, pk_type, &crt->pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

    /* Look for a parent in trusted CAs */
    for( parent = trust_ca; parent != NULL; parent = parent->next )
    {
        if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
            break;
    }

    if( parent != NULL )
    {
        ret = x509_crt_verify_top( crt, parent, ca_crl, profile,
                                   pathlen, selfsigned, flags, f_vrfy, p_vrfy );
        if( ret != 0 )
            return( ret );
    }
    else
    {
        /* Look for a parent upwards the chain */
        for( parent = crt->next; parent != NULL; parent = parent->next )
            if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
                break;

        /* Are we part of the chain or at the top? */
        if( parent != NULL )
        {
            ret = x509_crt_verify_child( crt, parent, trust_ca, ca_crl, profile,
                                         pathlen, selfsigned, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
        else
        {
            ret = x509_crt_verify_top( crt, trust_ca, ca_crl, profile,
                                       pathlen, selfsigned, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
    }

    if( *flags != 0 )
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );

    return( 0 );
}